

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Matrix * __thiscall rw::Matrix::transform(Matrix *this,Matrix *mat,CombineOp op)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  Matrix *src2;
  Matrix *src1;
  Matrix tmp;
  Matrix local_50;
  
  src2 = mat;
  src1 = this;
  if ((op == COMBINEPOSTCONCAT) || (src2 = this, src1 = mat, op == COMBINEPRECONCAT)) {
    mult(&local_50,src1,src2);
    (this->right).x = local_50.right.x;
    (this->right).y = local_50.right.y;
    *(undefined8 *)&(this->right).z = local_50._8_8_;
    (this->up).x = local_50.up.x;
    (this->up).y = local_50.up.y;
    *(undefined8 *)&(this->up).z = local_50._24_8_;
    (this->at).x = local_50.at.x;
    (this->at).y = local_50.at.y;
    *(undefined8 *)&(this->at).z = local_50._40_8_;
    (this->pos).x = local_50.pos.x;
    (this->pos).y = local_50.pos.y;
    *(undefined8 *)&(this->pos).z = local_50._56_8_;
  }
  else if (op == COMBINEREPLACE) {
    fVar10 = (mat->right).x;
    fVar11 = (mat->right).y;
    uVar1 = *(undefined8 *)&(mat->right).z;
    fVar8 = (mat->up).x;
    fVar9 = (mat->up).y;
    uVar2 = *(undefined8 *)&(mat->up).z;
    fVar6 = (mat->at).x;
    fVar7 = (mat->at).y;
    uVar3 = *(undefined8 *)&(mat->at).z;
    fVar5 = (mat->pos).y;
    uVar4 = *(undefined8 *)&(mat->pos).z;
    (this->pos).x = (mat->pos).x;
    (this->pos).y = fVar5;
    *(undefined8 *)&(this->pos).z = uVar4;
    (this->at).x = fVar6;
    (this->at).y = fVar7;
    *(undefined8 *)&(this->at).z = uVar3;
    (this->up).x = fVar8;
    (this->up).y = fVar9;
    *(undefined8 *)&(this->up).z = uVar2;
    (this->right).x = fVar10;
    (this->right).y = fVar11;
    *(undefined8 *)&(this->right).z = uVar1;
  }
  return this;
}

Assistant:

Matrix*
Matrix::transform(const Matrix *mat, CombineOp op)
{
	Matrix tmp;
	switch(op){
	case COMBINEREPLACE:
		*this = *mat;
		break;
	case COMBINEPRECONCAT:
		mult(&tmp, mat, this);
		*this = tmp;
		break;
	case COMBINEPOSTCONCAT:
		mult(&tmp, this, mat);
		*this = tmp;
		break;
	}
	return this;
}